

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O2

void __thiscall
Js::WebAssemblyModule::AllocateFunctionExports(WebAssemblyModule *this,uint32 entries)

{
  WasmExport *ptr;
  
  ptr = Memory::AllocateArray<Memory::ArenaAllocator,Wasm::WasmExport,false>
                  ((Memory *)this->m_alloc,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                   (ulong)entries);
  Memory::WriteBarrierPtr<Wasm::WasmExport>::WriteBarrierSet(&this->m_exports,ptr);
  this->m_exportCount = entries;
  return;
}

Assistant:

void
WebAssemblyModule::AllocateFunctionExports(uint32 entries)
{
    m_exports = AnewArrayZ(m_alloc, Wasm::WasmExport, entries);
    m_exportCount = entries;
}